

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall Transaction_GetRwInt_Test::TestBody(Transaction_GetRwInt_Test *this)

{
  MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *this_00;
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *pTVar1;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *this_01;
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *pTVar2
  ;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_2a0;
  unique_lock<mock_mutex> local_288;
  undefined1 local_278 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_228;
  Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_210;
  ExpectationSet local_1f0;
  WithoutMatchers local_1b9;
  Matcher<bool> local_1b8;
  Matcher<bool> local_1a0;
  Matcher<unsigned_long> local_188;
  address local_170;
  ComparisonBase<testing::internal::GeMatcher<pstore::address>,_pstore::address,_testing::internal::AnyGe>
  local_168;
  Matcher<pstore::address> local_160;
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> local_148;
  code *local_e0;
  undefined8 local_d8;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
  local_d0;
  Action<pstore::address_(unsigned_long,_unsigned_int)> local_b8;
  WithoutMatchers local_95 [13];
  Matcher<unsigned_int> local_88;
  Matcher<unsigned_long> local_70;
  MockSpec<pstore::address_(unsigned_long,_unsigned_int)> local_58;
  undefined1 local_20 [8];
  Expectation allocate_int;
  Transaction_GetRwInt_Test *this_local;
  
  allocate_int.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  testing::Matcher<unsigned_long>::Matcher(&local_70,4);
  testing::Matcher<unsigned_int>::Matcher(&local_88,4);
  anon_unknown.dwarf_2883f3::mock_database::gmock_allocate
            (&local_58,&(this->super_Transaction).db_,&local_70,&local_88);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::operator()
                      (&local_58,local_95,(void *)0x0);
  pTVar1 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
           InternalExpectedAt(this_00,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b0,"db_","allocate (sizeof (int), alignof (int))");
  local_e0 = anon_unknown.dwarf_2883f3::mock_database::base_allocate;
  local_d8 = 0;
  testing::
  Invoke<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
            (&local_d0,(testing *)&(this->super_Transaction).db_,
             (mock_database *)anon_unknown.dwarf_2883f3::mock_database::base_allocate,0);
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
            (&local_b8,&local_d0);
  pTVar1 = testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::
           WillOnce(pTVar1,&local_b8);
  testing::Expectation::Expectation((Expectation *)local_20,&pTVar1->super_ExpectationBase);
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::~Action(&local_b8);
  testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::~MockSpec(&local_58);
  testing::Matcher<unsigned_int>::~Matcher(&local_88);
  testing::Matcher<unsigned_long>::~Matcher(&local_70);
  pstore::address::address(&local_170,0xb0);
  local_168.rhs_.a_ = (address)testing::Ge<pstore::address>(local_170);
  testing::Matcher<pstore::address>::Matcher<testing::internal::GeMatcher<pstore::address>,void>
            (&local_160,(GeMatcher<pstore::address> *)&local_168);
  testing::Matcher<unsigned_long>::Matcher(&local_188,4);
  testing::Matcher<bool>::Matcher(&local_1a0,false);
  testing::Matcher<bool>::Matcher(&local_1b8,true);
  anon_unknown.dwarf_2883f3::mock_database::gmock_get
            (&local_148,&(this->super_Transaction).db_,&local_160,&local_188,&local_1a0,&local_1b8);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
            operator()(&local_148,&local_1b9,(void *)0x0);
  pTVar2 = testing::internal::
           MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
           InternalExpectedAt(this_01,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b6,"db_",
                              "get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}), sizeof (int), false, true)"
                             );
  testing::ExpectationSet::ExpectationSet(&local_1f0,(Expectation *)local_20);
  pTVar2 = testing::internal::
           TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
           ::After(pTVar2,&local_1f0);
  testing::
  Invoke<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>
            (&local_228,(testing *)&(this->super_Transaction).db_,
             (mock_database *)anon_unknown.dwarf_2883f3::mock_database::base_get,0);
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)
             &local_210,&local_228);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(pTVar2,&local_210);
  testing::Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::~Action
            (&local_210);
  testing::ExpectationSet::~ExpectationSet(&local_1f0);
  testing::internal::
  MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::~MockSpec
            (&local_148);
  testing::Matcher<bool>::~Matcher(&local_1b8);
  testing::Matcher<bool>::~Matcher(&local_1a0);
  testing::Matcher<unsigned_long>::~Matcher(&local_188);
  testing::Matcher<pstore::address>::~Matcher(&local_160);
  testing::Expectation::~Expectation((Expectation *)local_20);
  std::unique_lock<mock_mutex>::unique_lock(&local_288,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_278,
          &(this->super_Transaction).db_.super_database,&local_288);
  std::unique_lock<mock_mutex>::~unique_lock(&local_288);
  pstore::transaction_base::alloc_rw<int,void>(&local_2a0,(transaction_base *)local_278,1);
  std::pair<std::shared_ptr<int>,_pstore::typed_address<int>_>::~pair(&local_2a0);
  pstore::transaction_base::commit((transaction_base *)local_278);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_278);
  return;
}

Assistant:

TEST_F (Transaction, GetRwInt) {
    // First setup the mock expectations.
    {
        using ::testing::Expectation;
        using ::testing::Ge;
        using ::testing::Invoke;

        Expectation allocate_int = EXPECT_CALL (db_, allocate (sizeof (int), alignof (int)))
                                       .WillOnce (Invoke (&db_, &mock_database::base_allocate));

        // A call to get(). First argument (address) must lie beyond the initial transaction
        // and must request a writable int.
        EXPECT_CALL (db_, get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}),
                               sizeof (int), false, true))
            .After (allocate_int)
            .WillOnce (Invoke (&db_, &mock_database::base_get));
    }
    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        transaction.alloc_rw<int> ();
        transaction.commit ();
    }
}